

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Computations.h
# Opt level: O0

void Contract_dyn(box *P,deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
                         *d_all_mes_vector,deque<double,_std::allocator<double>_> *alpha_mes_vector,
                 deque<double,_std::allocator<double>_> *t_history_vector,
                 deque<interval,_std::allocator<interval>_> *xhat_history_vector,
                 deque<interval,_std::allocator<interval>_> *yhat_history_vector,
                 deque<interval,_std::allocator<interval>_> *psihat_history_vector,
                 deque<interval,_std::allocator<interval>_> *vrxhat_history_vector,double *d_max_err
                 ,double *alpha_max_err,int *sdir,interval *alphashat,
                 vector<double,_std::allocator<double>_> *walls_xa,
                 vector<double,_std::allocator<double>_> *walls_ya,
                 vector<double,_std::allocator<double>_> *walls_xb,
                 vector<double,_std::allocator<double>_> *walls_yb,
                 vector<double,_std::allocator<double>_> *circles_x,
                 vector<double,_std::allocator<double>_> *circles_y,
                 vector<double,_std::allocator<double>_> *circles_r)

{
  double dVar1;
  int iVar2;
  bool bVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  reference x;
  reference pvVar7;
  interval *piVar8;
  reference pvVar9;
  interval local_4e8;
  interval local_4d0;
  box local_4b8;
  interval local_4a8;
  interval local_490;
  interval local_478;
  interval local_460;
  interval local_448;
  interval local_430;
  interval local_418;
  interval local_400;
  interval local_3e8;
  interval local_3d0;
  double local_3b8;
  double dt;
  interval yk;
  interval xk;
  interval local_368;
  interval local_350;
  interval local_338;
  interval local_320;
  interval local_308;
  box local_2f0;
  vector<double,_std::allocator<double>_> local_2e0;
  vector<double,_std::allocator<double>_> local_2c8;
  vector<double,_std::allocator<double>_> local_2b0;
  vector<double,_std::allocator<double>_> local_298;
  vector<double,_std::allocator<double>_> local_280;
  vector<double,_std::allocator<double>_> local_268;
  vector<double,_std::allocator<double>_> local_250;
  undefined1 local_238 [8];
  interval yt;
  interval xt;
  interval local_1f0;
  interval local_1d8;
  interval local_1c0;
  double local_1a8;
  double local_1a0;
  interval local_198;
  double local_180;
  double local_178;
  interval local_170;
  undefined1 local_158 [8];
  box Pt;
  interval local_130;
  undefined1 local_118 [8];
  box Pxyj;
  double local_100;
  interval local_f8;
  undefined1 local_e0 [8];
  interval dhat;
  double local_b8;
  double local_b0;
  undefined1 local_a8 [8];
  interval alphahat;
  vector<box,_std::allocator<box>_> Pj;
  vector<int,_std::allocator<int>_> Pigroup;
  vector<box,_std::allocator<box>_> Pi;
  int local_40;
  int k;
  int j;
  int i;
  deque<interval,_std::allocator<interval>_> *yhat_history_vector_local;
  deque<interval,_std::allocator<interval>_> *xhat_history_vector_local;
  deque<double,_std::allocator<double>_> *t_history_vector_local;
  deque<double,_std::allocator<double>_> *alpha_mes_vector_local;
  deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
  *d_all_mes_vector_local;
  box *P_local;
  
  k = 0;
  _j = yhat_history_vector;
  yhat_history_vector_local = xhat_history_vector;
  xhat_history_vector_local = (deque<interval,_std::allocator<interval>_> *)t_history_vector;
  t_history_vector_local = alpha_mes_vector;
  alpha_mes_vector_local = (deque<double,_std::allocator<double>_> *)d_all_mes_vector;
  d_all_mes_vector_local =
       (deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
        *)P;
  std::vector<box,_std::allocator<box>_>::vector
            ((vector<box,_std::allocator<box>_> *)
             &Pigroup.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &Pj.super__Vector_base<box,_std::allocator<box>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<box,_std::allocator<box>_>::clear
            ((vector<box,_std::allocator<box>_> *)
             &Pigroup.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::clear
            ((vector<int,_std::allocator<int>_> *)
             &Pj.super__Vector_base<box,_std::allocator<box>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  k = 0;
  do {
    iVar2 = k;
    sVar4 = std::deque<double,_std::allocator<double>_>::size(t_history_vector_local);
    if ((int)sVar4 <= iVar2) {
      sVar4 = std::vector<box,_std::allocator<box>_>::size
                        ((vector<box,_std::allocator<box>_> *)
                         &Pigroup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      if (sVar4 != 0) {
        C_acc_opt((box *)d_all_mes_vector_local,
                  (vector<box,_std::allocator<box>_> *)
                  &Pigroup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
        C_acc_opt((box *)d_all_mes_vector_local,
                  (vector<box,_std::allocator<box>_> *)
                  &Pigroup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 &Pj.super__Vector_base<box,_std::allocator<box>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage);
      std::vector<box,_std::allocator<box>_>::~vector
                ((vector<box,_std::allocator<box>_> *)
                 &Pigroup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      return;
    }
    std::vector<box,_std::allocator<box>_>::vector
              ((vector<box,_std::allocator<box>_> *)&alphahat.isEmpty);
    std::vector<box,_std::allocator<box>_>::clear
              ((vector<box,_std::allocator<box>_> *)&alphahat.isEmpty);
    pvVar5 = std::deque<double,_std::allocator<double>_>::operator[](t_history_vector_local,(long)k)
    ;
    local_b0 = *pvVar5 - *alpha_max_err;
    pvVar5 = std::deque<double,_std::allocator<double>_>::operator[](t_history_vector_local,(long)k)
    ;
    local_b8 = *pvVar5 + *alpha_max_err;
    interval::interval((interval *)local_a8,&local_b0,&local_b8);
    local_40 = 0;
    while( true ) {
      pvVar6 = std::
               deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
               ::operator[]((deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
                             *)alpha_mes_vector_local,(long)k);
      sVar4 = std::vector<interval,_std::allocator<interval>_>::size(pvVar6);
      if ((int)sVar4 <= local_40) break;
      pvVar6 = std::
               deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
               ::operator[]((deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
                             *)alpha_mes_vector_local,(long)k);
      x = std::vector<interval,_std::allocator<interval>_>::operator[](pvVar6,(long)local_40);
      local_100 = -*d_max_err;
      Pxyj._8_8_ = *d_max_err;
      interval::interval(&local_f8,&local_100,(double *)&Pxyj.dim);
      operator+((interval *)local_e0,x,&local_f8);
      pvVar7 = std::deque<interval,_std::allocator<interval>_>::operator[]
                         (yhat_history_vector_local,(long)k);
      interval::interval(&local_130,pvVar7);
      pvVar7 = std::deque<interval,_std::allocator<interval>_>::operator[](_j,(long)k);
      interval::interval((interval *)&Pt.dim,pvVar7);
      box::box((box *)local_118,(vector<interval,_std::allocator<interval>_> *)&local_130,
               (vector<interval,_std::allocator<interval>_> *)&Pt.dim);
      local_178 = std::numeric_limits<double>::infinity();
      local_178 = -local_178;
      local_180 = std::numeric_limits<double>::infinity();
      interval::interval(&local_170,&local_178,&local_180);
      local_1a0 = std::numeric_limits<double>::infinity();
      local_1a0 = -local_1a0;
      local_1a8 = std::numeric_limits<double>::infinity();
      interval::interval(&local_198,&local_1a0,&local_1a8);
      box::box((box *)local_158,(vector<interval,_std::allocator<interval>_> *)&local_170,
               (vector<interval,_std::allocator<interval>_> *)&local_198);
      interval::interval(&local_1c0,(interval *)local_e0);
      operator*((interval *)&xt.isEmpty,(double)*sdir,(interval *)local_a8);
      operator+(&local_1f0,(interval *)&xt.isEmpty,alphashat);
      pvVar7 = std::deque<interval,_std::allocator<interval>_>::operator[]
                         (psihat_history_vector,(long)k);
      operator+(&local_1d8,&local_1f0,pvVar7);
      BoxTranslate((box *)local_118,(box *)local_158,&local_1c0,&local_1d8,1);
      piVar8 = box::operator[]((box *)local_158,1);
      interval::interval((interval *)&yt.isEmpty,piVar8);
      piVar8 = box::operator[]((box *)local_158,2);
      interval::interval((interval *)local_238,piVar8);
      std::vector<double,_std::allocator<double>_>::vector(&local_250,walls_xa);
      std::vector<double,_std::allocator<double>_>::vector(&local_268,walls_ya);
      std::vector<double,_std::allocator<double>_>::vector(&local_280,walls_xb);
      std::vector<double,_std::allocator<double>_>::vector(&local_298,walls_yb);
      std::vector<double,_std::allocator<double>_>::vector(&local_2b0,circles_x);
      std::vector<double,_std::allocator<double>_>::vector(&local_2c8,circles_y);
      std::vector<double,_std::allocator<double>_>::vector(&local_2e0,circles_r);
      CPointInSegmentsOrCircles
                ((interval *)&yt.isEmpty,(interval *)local_238,&local_250,&local_268,&local_280,
                 &local_298,&local_2b0,&local_2c8,&local_2e0);
      std::vector<double,_std::allocator<double>_>::~vector(&local_2e0);
      std::vector<double,_std::allocator<double>_>::~vector(&local_2c8);
      std::vector<double,_std::allocator<double>_>::~vector(&local_2b0);
      std::vector<double,_std::allocator<double>_>::~vector(&local_298);
      std::vector<double,_std::allocator<double>_>::~vector(&local_280);
      std::vector<double,_std::allocator<double>_>::~vector(&local_268);
      std::vector<double,_std::allocator<double>_>::~vector(&local_250);
      if (((xt.sup._0_1_ & 1) == 0) && ((yt.sup._0_1_ & 1) == 0)) {
        interval::interval(&local_308,(interval *)&yt.isEmpty);
        interval::interval(&local_320,(interval *)local_238);
        box::box(&local_2f0,(vector<interval,_std::allocator<interval>_> *)&local_308,
                 (vector<interval,_std::allocator<interval>_> *)&local_320);
        box::operator=((box *)local_158,&local_2f0);
        box::~box(&local_2f0);
        interval::interval(&local_338,(interval *)local_e0);
        operator*((interval *)&xk.isEmpty,(double)*sdir,(interval *)local_a8);
        operator+(&local_368,(interval *)&xk.isEmpty,alphashat);
        pvVar7 = std::deque<interval,_std::allocator<interval>_>::operator[]
                           (psihat_history_vector,(long)k);
        operator+(&local_350,&local_368,pvVar7);
        BoxTranslate((box *)local_118,(box *)local_158,&local_338,&local_350,-1);
        pvVar7 = std::deque<interval,_std::allocator<interval>_>::operator[]
                           (yhat_history_vector_local,(long)k);
        piVar8 = box::operator[]((box *)local_118,1);
        operator&((interval *)&yk.isEmpty,pvVar7,piVar8);
        pvVar7 = std::deque<interval,_std::allocator<interval>_>::operator[](_j,(long)k);
        piVar8 = box::operator[]((box *)local_118,2);
        operator&((interval *)&dt,pvVar7,piVar8);
        for (Pi.super__Vector_base<box,_std::allocator<box>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage._4_4_ = k;
            sVar4 = std::deque<double,_std::allocator<double>_>::size(t_history_vector_local),
            Pi.super__Vector_base<box,_std::allocator<box>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._4_4_ < (int)sVar4 + -1;
            Pi.super__Vector_base<box,_std::allocator<box>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._4_4_ =
                 Pi.super__Vector_base<box,_std::allocator<box>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage._4_4_ + 1) {
          pvVar5 = std::deque<double,_std::allocator<double>_>::operator[]
                             ((deque<double,_std::allocator<double>_> *)xhat_history_vector_local,
                              (long)(Pi.super__Vector_base<box,_std::allocator<box>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage._4_4_ + 1));
          dVar1 = *pvVar5;
          pvVar5 = std::deque<double,_std::allocator<double>_>::operator[]
                             ((deque<double,_std::allocator<double>_> *)xhat_history_vector_local,
                              (long)Pi.super__Vector_base<box,_std::allocator<box>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage._4_4_);
          local_3b8 = dVar1 - *pvVar5;
          pvVar7 = std::deque<interval,_std::allocator<interval>_>::operator[]
                             (yhat_history_vector_local,
                              (long)(Pi.super__Vector_base<box,_std::allocator<box>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage._4_4_ + 1));
          dVar1 = local_3b8;
          pvVar9 = std::deque<interval,_std::allocator<interval>_>::operator[]
                             (vrxhat_history_vector,
                              (long)Pi.super__Vector_base<box,_std::allocator<box>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage._4_4_);
          operator*(&local_418,dVar1,pvVar9);
          pvVar9 = std::deque<interval,_std::allocator<interval>_>::operator[]
                             (psihat_history_vector,
                              (long)Pi.super__Vector_base<box,_std::allocator<box>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage._4_4_);
          Cos(&local_430,pvVar9);
          operator*(&local_400,&local_418,&local_430);
          operator+(&local_3e8,(interval *)&yk.isEmpty,&local_400);
          operator&(&local_3d0,pvVar7,&local_3e8);
          interval::operator=((interval *)&yk.isEmpty,&local_3d0);
          pvVar7 = std::deque<interval,_std::allocator<interval>_>::operator[]
                             (_j,(long)(Pi.super__Vector_base<box,_std::allocator<box>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage._4_4_ + 1));
          dVar1 = local_3b8;
          pvVar9 = std::deque<interval,_std::allocator<interval>_>::operator[]
                             (vrxhat_history_vector,
                              (long)Pi.super__Vector_base<box,_std::allocator<box>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage._4_4_);
          operator*(&local_490,dVar1,pvVar9);
          pvVar9 = std::deque<interval,_std::allocator<interval>_>::operator[]
                             (psihat_history_vector,
                              (long)Pi.super__Vector_base<box,_std::allocator<box>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage._4_4_);
          Sin(&local_4a8,pvVar9);
          operator*(&local_478,&local_490,&local_4a8);
          operator+(&local_460,(interval *)&dt,&local_478);
          operator&(&local_448,pvVar7,&local_460);
          interval::operator=((interval *)&dt,&local_448);
          if (((xk.sup._0_1_ & 1) != 0) || ((yk.sup._0_1_ & 1) != 0)) break;
        }
        interval::interval(&local_4d0,(interval *)&yk.isEmpty);
        interval::interval(&local_4e8,(interval *)&dt);
        box::box(&local_4b8,(vector<interval,_std::allocator<interval>_> *)&local_4d0,
                 (vector<interval,_std::allocator<interval>_> *)&local_4e8);
        box::operator=((box *)local_118,&local_4b8);
        box::~box(&local_4b8);
        bVar3 = box::IsEmpty((box *)local_118);
        if (!bVar3) {
          std::vector<box,_std::allocator<box>_>::push_back
                    ((vector<box,_std::allocator<box>_> *)
                     &Pigroup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(value_type *)local_118);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     &Pj.super__Vector_base<box,_std::allocator<box>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,&k);
        }
      }
      box::~box((box *)local_158);
      box::~box((box *)local_118);
      local_40 = local_40 + 1;
    }
    std::vector<box,_std::allocator<box>_>::~vector
              ((vector<box,_std::allocator<box>_> *)&alphahat.isEmpty);
    k = k + 1;
  } while( true );
}

Assistant:

inline void Contract_dyn(box& P, deque< vector<interval> >& d_all_mes_vector, deque<double>& alpha_mes_vector, 
						 deque<double>& t_history_vector, deque<interval>& xhat_history_vector, deque<interval>& yhat_history_vector, 
						 deque<interval>& psihat_history_vector, deque<interval>& vrxhat_history_vector, 
						 double& d_max_err, double& alpha_max_err, int& sdir, interval& alphashat, 
						 vector<double>& walls_xa, vector<double>& walls_ya, vector<double>& walls_xb, vector<double>& walls_yb, 
						 vector<double>& circles_x, vector<double>& circles_y, vector<double>& circles_r)
{
	int i = 0, j = 0, k = 0;
	vector<box> Pi;
	vector<int> Pigroup;

	Pi.clear();
	Pigroup.clear();
	for (i = 0; i < (int)alpha_mes_vector.size(); i++)
	{
		vector<box> Pj;
		Pj.clear();
		interval alphahat = interval(alpha_mes_vector[i]-alpha_max_err,alpha_mes_vector[i]+alpha_max_err);
		for (j = 0; j < (int)d_all_mes_vector[i].size(); j++)
		{
			interval dhat = d_all_mes_vector[i][j]+interval(-d_max_err,+d_max_err);
			//
			// Activate only if using getfirst or getlast...
			// If no obstacle found...
			//if ((Center(d_all_mes_vector[i][j]) < 0)||(Center(d_all_mes_vector[i][j]) > rangescale)||(d_all_mes_vector[i][j].isEmpty)) 
			//{
			//	dhat = interval(rangescale-d_max_err,oo);
			//	printf("Bad dhat\n");
			//}
			//

			box Pxyj = box(xhat_history_vector[i],yhat_history_vector[i]);
			box Pt = box(interval(-oo,oo),interval(-oo,oo)); 
			BoxTranslate(Pxyj, Pt, dhat, sdir*alphahat+alphashat+psihat_history_vector[i], 1);
			interval xt = Pt[1];
			interval yt = Pt[2];
			CPointInSegmentsOrCircles(xt,yt,walls_xa,walls_ya,walls_xb,walls_yb,circles_x,circles_y,circles_r);
			if ((!xt.isEmpty)&&(!yt.isEmpty))
			{
				Pt = box(xt,yt);
				BoxTranslate(Pxyj, Pt, dhat, sdir*alphahat+alphashat+psihat_history_vector[i], -1);

				// Propagate forward to current position...
				interval xk = xhat_history_vector[i] & Pxyj[1];
				interval yk = yhat_history_vector[i] & Pxyj[2];
				for (k = i; k < (int)alpha_mes_vector.size()-1; k++)
				{
					double dt = t_history_vector[k+1]-t_history_vector[k];
					xk = xhat_history_vector[k+1] & (xk+dt*vrxhat_history_vector[k]*Cos(psihat_history_vector[k]));
					yk = yhat_history_vector[k+1] & (yk+dt*vrxhat_history_vector[k]*Sin(psihat_history_vector[k]));
					if ((xk.isEmpty)||(yk.isEmpty)) break;
				}
				Pxyj = box(xk,yk);

				if (!Pxyj.IsEmpty())
				{
					//Pj.push_back(Pxyj);
					Pi.push_back(Pxyj);
					Pigroup.push_back(i);
				}
			}
		}
		//box Pxy = Union(Pj);
		//if (!Pxy.IsEmpty())
		//{
		//	Pi.push_back(Pxy);
		//}
	}
	if (Pi.size() > 0)
	{
		//C_q_in_group(P, alpha_mes_vector.size()-nb_outliers, Pi, Pigroup, alpha_mes_vector.size());
		//C_acc_group(P, Pi, Pigroup, alpha_mes_vector.size());
		//C_q_in(P, Pi.size()-nb_outliers, Pi);
		//C_q_in(P, alpha_mes_vector.size()-nb_outliers, Pi);
		C_acc_opt(P, Pi);
		C_acc_opt(P, Pi);
	}
}